

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathedit.cpp
# Opt level: O2

QStringList * __thiscall
QPathEdit::modelFilters
          (QStringList *__return_storage_ptr__,QPathEdit *this,QStringList *normalFilters)

{
  char cVar1;
  int iVar2;
  QForeachContainer<QList<QString>_> _container_370;
  QRegularExpressionMatch match;
  QString filter;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<QString> local_48;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  if (modelFilters(QList<QString>const&)::re == '\0') {
    iVar2 = __cxa_guard_acquire(&modelFilters(QList<QString>const&)::re);
    if (iVar2 != 0) {
      QString::QString((QString *)&_container_370,"^.*\\((.*)\\)$");
      QRegularExpression::QRegularExpression
                ((QRegularExpression *)&modelFilters(QList<QString>const&)::re,&_container_370,0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&_container_370);
      __cxa_atexit(QRegularExpression::~QRegularExpression,&modelFilters(QList<QString>const&)::re,
                   &__dso_handle);
      __cxa_guard_release(&modelFilters(QList<QString>const&)::re);
    }
  }
  if (modelFilters(QList<QString>const&)::re2 == '\0') {
    iVar2 = __cxa_guard_acquire(&modelFilters(QList<QString>const&)::re2);
    if (iVar2 != 0) {
      QString::QString((QString *)&_container_370,"\\s");
      QRegularExpression::QRegularExpression
                ((QRegularExpression *)&modelFilters(QList<QString>const&)::re2,&_container_370,0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&_container_370);
      __cxa_atexit(QRegularExpression::~QRegularExpression,&modelFilters(QList<QString>const&)::re2,
                   &__dso_handle);
      __cxa_guard_release(&modelFilters(QList<QString>const&)::re2);
    }
  }
  QtPrivate::QForeachContainer<QList<QString>_>::QForeachContainer(&_container_370,normalFilters);
  for (; _container_370.i.i != _container_370.e.i; _container_370.i.i = _container_370.i.i + 1) {
    filter.d.d = ((_container_370.i.i)->d).d;
    filter.d.ptr = ((_container_370.i.i)->d).ptr;
    filter.d.size = ((_container_370.i.i)->d).size;
    if (filter.d.d != (Data *)0x0) {
      LOCK();
      ((filter.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((filter.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QRegularExpression::match(&match,&modelFilters(QList<QString>const&)::re,&filter.d,0,0,0);
    cVar1 = QRegularExpressionMatch::hasMatch();
    if (cVar1 != '\0') {
      QRegularExpressionMatch::captured((int)&local_60);
      QString::split(&local_48,&local_60,&modelFilters(QList<QString>const&)::re2,0);
      QList<QString>::append(__return_storage_ptr__,(QList<QString> *)&local_48);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    QRegularExpressionMatch::~QRegularExpressionMatch(&match);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&filter.d);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&_container_370);
  return __return_storage_ptr__;
}

Assistant:

QStringList QPathEdit::modelFilters(const QStringList &normalFilters) {
	QStringList res;
    static QRegularExpression re = QRegularExpression("^.*\\((.*)\\)$");
    static QRegularExpression re2 = QRegularExpression("\\s");
    foreach(QString filter, normalFilters) {
        QRegularExpressionMatch match = re.match(filter);
        if(match.hasMatch()) {
            res.append(match.captured(1).split(re2));
        }
	}
	return res;
}